

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EffectManager.cpp
# Opt level: O2

unique_ptr<EffectManager,_std::default_delete<EffectManager>_> EffectManager::create(void)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  *this;
  long lVar1;
  __uniq_ptr_data<EffectManager,_std::default_delete<EffectManager>,_true,_true> in_RDI;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>
  __l;
  allocator_type local_15a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_159;
  shared_ptr<EffectManager::EffectLauncher<FNEffect>_> local_158;
  shared_ptr<EffectManager::EffectLauncher<NFEffect>_> local_148;
  shared_ptr<EffectManager::EffectLauncher<RLEffect>_> local_138;
  shared_ptr<EffectManager::EffectLauncher<LREffect>_> local_128;
  EffectMap_t effects;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  local_e8 [4];
  
  std::make_shared<EffectManager::EffectLauncher<LREffect>>();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  ::pair<const_char_(&)[3],_std::shared_ptr<EffectManager::EffectLauncher<LREffect>_>,_true>
            (local_e8,(char (*) [3])"lr",&local_128);
  std::make_shared<EffectManager::EffectLauncher<RLEffect>>();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  ::pair<const_char_(&)[3],_std::shared_ptr<EffectManager::EffectLauncher<RLEffect>_>,_true>
            (local_e8 + 1,(char (*) [3])"rl",&local_138);
  std::make_shared<EffectManager::EffectLauncher<NFEffect>>();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  ::pair<const_char_(&)[3],_std::shared_ptr<EffectManager::EffectLauncher<NFEffect>_>,_true>
            (local_e8 + 2,(char (*) [3])"nf",&local_148);
  std::make_shared<EffectManager::EffectLauncher<FNEffect>>();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
  ::pair<const_char_(&)[3],_std::shared_ptr<EffectManager::EffectLauncher<FNEffect>_>,_true>
            (local_e8 + 3,(char (*) [3])"fn",&local_158);
  __l._M_len = 4;
  __l._M_array = local_e8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  ::map(&effects,__l,&local_159,&local_15a);
  lVar1 = 0x90;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>
             *)((long)&local_e8[0].first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_158.
              super___shared_ptr<EffectManager::EffectLauncher<FNEffect>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_148.
              super___shared_ptr<EffectManager::EffectLauncher<NFEffect>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_138.
              super___shared_ptr<EffectManager::EffectLauncher<RLEffect>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.
              super___shared_ptr<EffectManager::EffectLauncher<LREffect>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
          *)operator_new(0x30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  ::_Rb_tree(this,&effects._M_t);
  *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
    **)in_RDI.super___uniq_ptr_impl<EffectManager,_std::default_delete<EffectManager>_>._M_t.
       super__Tuple_impl<0UL,_EffectManager_*,_std::default_delete<EffectManager>_>.
       super__Head_base<0UL,_EffectManager_*,_false>._M_head_impl = this;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<EffectManager::EffectLauncherInterface>_>_>_>
  ::~_Rb_tree(&effects._M_t);
  return (__uniq_ptr_data<EffectManager,_std::default_delete<EffectManager>,_true,_true>)
         (tuple<EffectManager_*,_std::default_delete<EffectManager>_>)
         in_RDI.super___uniq_ptr_impl<EffectManager,_std::default_delete<EffectManager>_>._M_t.
         super__Tuple_impl<0UL,_EffectManager_*,_std::default_delete<EffectManager>_>.
         super__Head_base<0UL,_EffectManager_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<EffectManager> EffectManager::create() 
{
	EffectMap_t effects = 
	{
		{"lr", std::make_shared<EffectLauncher<LREffect>>()},
		{"rl", std::make_shared<EffectLauncher<RLEffect>>()},
		{"nf", std::make_shared<EffectLauncher<NFEffect>>()},
		{"fn", std::make_shared<EffectLauncher<FNEffect>>()},
	};

	auto mgt = new EffectManager(effects);
	if (!mgt) 
	{
		return nullptr;
	}

	return std::unique_ptr<EffectManager>(std::move(mgt));
}